

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

ON_Curve * __thiscall ON_PolyCurve::ExplodeSingleSegmentCurve(ON_PolyCurve *this)

{
  ON_Interval domain;
  int iVar1;
  ON_Curve *pOVar2;
  undefined4 extraout_var;
  ON_PolyCurve *pOVar3;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  ON_PolyCurve *pSegPly;
  ON_Curve *pSeg;
  ON_PolyCurve *this_local;
  
  iVar1 = Count(this);
  if (iVar1 == 1) {
    pOVar2 = SegmentCurve(this,0);
    iVar1 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
    this_local = (ON_PolyCurve *)CONCAT44(extraout_var,iVar1);
    if (this_local == (ON_PolyCurve *)0x0) {
      this_local = (ON_PolyCurve *)0x0;
    }
    else {
      pOVar3 = Cast((ON_Object *)this_local);
      if (pOVar3 == (ON_PolyCurve *)0x0) {
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
        domain.m_t[1] = in_XMM1_Qa;
        domain.m_t[0] = extraout_XMM0_Qa;
        ON_Curve::SetDomain((ON_Curve *)this_local,domain);
        ON_Object::CopyUserData
                  ((ON_Object *)this_local,(ON_Object *)this,(ON_UUID)ZEXT816((ulong)0),
                   source_object);
      }
      else {
        if (this_local != (ON_PolyCurve *)0x0) {
          (*(this_local->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
        }
        this_local = (ON_PolyCurve *)0x0;
      }
    }
  }
  else {
    this_local = (ON_PolyCurve *)0x0;
  }
  return &this_local->super_ON_Curve;
}

Assistant:

ON_Curve* ON_PolyCurve::ExplodeSingleSegmentCurve() const

{
  if (Count() != 1)
    return 0;
  ON_Curve* pSeg = SegmentCurve(0)->DuplicateCurve();
  if (!pSeg)
    return 0;
  ON_PolyCurve* pSegPly = ON_PolyCurve::Cast(pSeg);
  if (pSegPly){
    delete pSeg;
    return 0;
  }
  pSeg->SetDomain(Domain());
  pSeg->CopyUserData(*this,ON_nil_uuid,ON_Object::UserDataConflictResolution::source_object);
  return pSeg;
}